

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

ReadFileResult
anon_unknown.dwarf_a6dc0e::SubConditionHelper
          (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
           *out,Value *value)

{
  bool bVar1;
  uint uVar2;
  pointer pCVar3;
  ReadFileResult result;
  unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  ptr;
  Value *value_local;
  unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  *out_local;
  
  ptr._M_t.
  super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>,_true,_true>
        )(__uniq_ptr_data<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>,_true,_true>
          )value;
  std::
  unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>::
  unique_ptr<std::default_delete<cmCMakePresetsGraph::Condition>,void>
            ((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
              *)&stack0xffffffffffffffd8);
  out_local._4_4_ =
       ConditionHelper((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                        *)&stack0xffffffffffffffd8,
                       (Value *)ptr._M_t.
                                super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>.
                                _M_head_impl);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stack0xffffffffffffffd8);
  if (bVar1) {
    pCVar3 = std::
             unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             ::operator->((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           *)&stack0xffffffffffffffd8);
    uVar2 = (*pCVar3->_vptr_Condition[3])();
    if ((uVar2 & 1) != 0) {
      out_local._4_4_ = INVALID_CONDITION;
      goto LAB_0056c488;
    }
  }
  std::
  unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>::
  operator=(out,(unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                 *)&stack0xffffffffffffffd8);
LAB_0056c488:
  std::
  unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>::
  ~unique_ptr((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
               *)&stack0xffffffffffffffd8);
  return out_local._4_4_;
}

Assistant:

ReadFileResult SubConditionHelper(
  std::unique_ptr<cmCMakePresetsGraph::Condition>& out,
  const Json::Value* value)
{
  std::unique_ptr<cmCMakePresetsGraph::Condition> ptr;
  auto result = ConditionHelper(ptr, value);
  if (ptr && ptr->IsNull()) {
    return ReadFileResult::INVALID_CONDITION;
  }
  out = std::move(ptr);
  return result;
}